

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O1

bool Fossilize::add_application_filters
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
                *output,Value *filters)

{
  ushort uVar1;
  short sVar2;
  pointer pEVar3;
  char *pcVar4;
  ConstMemberIterator CVar5;
  Number NVar6;
  Type pGVar7;
  Ch *pCVar8;
  mapped_type *pmVar9;
  uint default_value;
  uint default_value_00;
  undefined8 extraout_RDX;
  undefined8 uVar10;
  undefined8 extraout_RDX_00;
  undefined8 unaff_RBX;
  ulong uVar11;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>> *this;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  Pointer pVVar12;
  bool bVar13;
  AppInfo info;
  allocator local_139;
  Data local_138;
  pointer local_128;
  uint local_11c;
  uint local_118;
  uint uStack_114;
  uint local_110;
  undefined1 local_10c;
  vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_> local_108;
  vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_> vStack_f0;
  vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_> local_d8;
  Data local_c0;
  undefined1 local_b0;
  undefined7 uStack_af;
  _Alloc_hider local_a0;
  char *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_60;
  Value *local_58;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_50;
  Pointer local_48;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *local_40;
  Type local_38;
  
  local_50 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)output;
  if ((filters->data_).f.flags == 3) {
    pVVar12 = (Pointer)((ulong)(filters->data_).s.str & 0xffffffffffff);
    CVar5 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberEnd(filters);
    uVar11 = CONCAT71((int7)((ulong)unaff_RBX >> 8),CVar5.ptr_ == pVVar12);
    if (CVar5.ptr_ != pVVar12) {
      uVar10 = extraout_RDX;
      local_58 = filters;
      do {
        if ((pVVar12->value).data_.f.flags != 3) {
          add_application_filters();
          break;
        }
        local_11c = (uint)uVar11;
        this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   *)&pVVar12->value;
        local_118 = 0x400000;
        uStack_114 = 0;
        local_110 = 0;
        local_10c = 1;
        local_d8.
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_f0.
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_f0.
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_108.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_f0.
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d8.
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_118 = default_get_member_uint((Value *)this_00,"minimumApiVersion",(uint)uVar10);
        local_110 = default_get_member_uint((Value *)this_00,"minimumEngineVersion",default_value);
        uStack_114 = default_get_member_uint
                               ((Value *)this_00,"minimumApplicationVersion",default_value_00);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_c0.s,(Ch *)this_00);
        uVar10 = local_c0.n;
        NVar6.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)this_00);
        if (uVar10 == NVar6.i64) {
          local_10c = true;
        }
        else {
          uVar1 = *(ushort *)(uVar10 + 0x1e);
          local_10c = uVar1 == 10 || (uVar1 & 8) == 0;
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_c0.s,(Ch *)this_00);
        uVar10 = local_c0.n;
        NVar6.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)this_00);
        if (uVar10 != NVar6.i64) {
          pGVar7 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(this_00,"blacklistedEnvironments");
          pEVar3 = local_108.
                   super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((pGVar7->data_).f.flags == 3) {
            if (local_108.
                super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_108.
                super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>._M_impl.
                super__Vector_impl_data._M_start) {
              std::_Destroy_aux<false>::__destroy<Fossilize::EnvInfo*>
                        (local_108.
                         super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_108.
                         super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              local_108.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish = pEVar3;
            }
            local_48 = pVVar12;
            if ((pGVar7->data_).f.flags != 3) {
              __assert_fail("IsObject()",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                            ,0x4d8,
                            "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberBegin() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                           );
            }
            pVVar12 = (Pointer)((ulong)(pGVar7->data_).s.str & 0xffffffffffff);
            local_38 = pGVar7;
            CVar5 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::MemberEnd(pGVar7);
            bVar13 = CVar5.ptr_ == pVVar12;
            if (!bVar13) {
              bVar13 = false;
              this = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      *)&pVVar12->value;
              local_40 = this_00;
              do {
                sVar2 = *(short *)(this + 0xe);
                if (sVar2 == 3) {
                  local_c0.s.str = (char *)0x0;
                  local_b0 = 0;
                  local_a0._M_p = (pointer)&local_90;
                  local_98 = (char *)0x0;
                  local_90._M_local_buf[0] = '\0';
                  local_78 = (char *)0x0;
                  local_70._M_local_buf[0] = '\0';
                  local_60 = 0;
                  local_c0.n = (Number)&local_b0;
                  local_80._M_p = (pointer)&local_70;
                  pCVar8 = rapidjson::
                           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        *)(this + -0x10));
                  uVar10 = local_c0.s.str;
                  strlen(pCVar8);
                  std::__cxx11::string::_M_replace((ulong)&local_c0,0,(char *)uVar10,(ulong)pCVar8);
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)&local_138.s,(Ch *)this);
                  uVar10 = local_138.n;
                  NVar6.i = (I)rapidjson::
                               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                            *)this);
                  if ((uVar10 != NVar6.i64) &&
                     (pGVar7 = rapidjson::
                               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               ::operator[]<char_const>(this,"contains"),
                     (undefined1  [16])
                     ((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x400000000000000) !=
                     (undefined1  [16])0x0)) {
                    pGVar7 = rapidjson::
                             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             ::operator[]<char_const>(this,"contains");
                    pCVar8 = rapidjson::
                             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ::GetString(pGVar7);
                    pcVar4 = local_98;
                    strlen(pCVar8);
                    std::__cxx11::string::_M_replace((ulong)&local_a0,0,pcVar4,(ulong)pCVar8);
                  }
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)&local_138.s,(Ch *)this);
                  uVar10 = local_138.n;
                  NVar6.i = (I)rapidjson::
                               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                            *)this);
                  if ((uVar10 != NVar6.i64) &&
                     (pGVar7 = rapidjson::
                               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               ::operator[]<char_const>(this,"equals"),
                     (undefined1  [16])
                     ((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x400000000000000) !=
                     (undefined1  [16])0x0)) {
                    pGVar7 = rapidjson::
                             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             ::operator[]<char_const>(this,"equals");
                    pCVar8 = rapidjson::
                             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ::GetString(pGVar7);
                    pcVar4 = local_78;
                    strlen(pCVar8);
                    std::__cxx11::string::_M_replace((ulong)&local_80,0,pcVar4,(ulong)pCVar8);
                  }
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)&local_138.s,(Ch *)this);
                  uVar10 = local_138.n;
                  NVar6.i = (I)rapidjson::
                               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                            *)this);
                  this_00 = local_40;
                  if ((uVar10 != NVar6.i64) &&
                     (pGVar7 = rapidjson::
                               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               ::operator[]<char_const>(this,"nonnull"),
                     (undefined1  [16])
                     ((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
                     (undefined1  [16])0x0)) {
                    pGVar7 = rapidjson::
                             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             ::operator[]<char_const>(this,"nonnull");
                    uVar1 = (pGVar7->data_).f.flags;
                    if ((uVar1 & 8) == 0) {
                      __assert_fail("IsBool()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                                    ,0x48b,
                                    "bool rapidjson::GenericValue<rapidjson::UTF8<>>::GetBool() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                                   );
                    }
                    local_60 = uVar1 == 10;
                  }
                  std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>::
                  emplace_back<Fossilize::EnvInfo>(&local_108,(EnvInfo *)&local_c0.s);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_80._M_p != &local_70) {
                    operator_delete(local_80._M_p,
                                    CONCAT71(local_70._M_allocated_capacity._1_7_,
                                             local_70._M_local_buf[0]) + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a0._M_p != &local_90) {
                    operator_delete(local_a0._M_p,
                                    CONCAT71(local_90._M_allocated_capacity._1_7_,
                                             local_90._M_local_buf[0]) + 1);
                  }
                  if (local_c0.n.i64 != (Number)&local_b0) {
                    operator_delete((void *)local_c0.n,CONCAT71(uStack_af,local_b0) + 1);
                  }
                }
                else {
                  add_application_filters();
                }
                if (sVar2 != 3) break;
                CVar5 = rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::MemberEnd(local_38);
                bVar13 = (Pointer)(this + 0x10) == CVar5.ptr_;
                this = this + 0x20;
              } while (!bVar13);
            }
            filters = local_58;
            pVVar12 = local_48;
            if (bVar13) goto LAB_00145e2a;
          }
          else {
            add_application_filters();
          }
LAB_0014601a:
          if (local_d8.
              super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.
                            super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_d8.
                                  super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.
                                  super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          uVar11 = (ulong)local_11c;
          if (vStack_f0.
              super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(vStack_f0.
                            super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)vStack_f0.
                                  super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)vStack_f0.
                                  super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>::~vector(&local_108);
          break;
        }
LAB_00145e2a:
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_c0.s,(Ch *)this_00);
        uVar10 = local_c0.n;
        NVar6.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)this_00);
        if (uVar10 != NVar6.i64) {
          pGVar7 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(this_00,"bucketVariantDependencies");
          bVar13 = parse_bucket_variant_dependencies(pGVar7,&vStack_f0);
          if (!bVar13) goto LAB_0014601a;
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_c0.s,(Ch *)this_00);
        uVar10 = local_c0.n;
        NVar6.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)this_00);
        if (uVar10 != NVar6.i64) {
          pGVar7 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(this_00,"bucketVariantFeatureDependencies");
          bVar13 = parse_bucket_variant_dependencies(pGVar7,&local_d8);
          if (!bVar13) goto LAB_0014601a;
        }
        pCVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(&pVVar12->name);
        std::__cxx11::string::string((string *)&local_c0.s,pCVar8,&local_139);
        pmVar9 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[](local_50,(key_type *)&local_c0.s);
        *(ulong *)((long)&pmVar9->minimum_application_version + 1) =
             CONCAT17(local_10c,CONCAT43(local_110,uStack_114._1_3_));
        pmVar9->minimum_api_version = local_118;
        pmVar9->minimum_application_version = uStack_114;
        local_138.n = (Number)(pmVar9->env_infos).
                              super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start;
        local_138.s.str =
             (Ch *)(pmVar9->env_infos).
                   super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        local_128 = (pmVar9->env_infos).
                    super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        (pmVar9->env_infos).
        super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_108.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (pmVar9->env_infos).
        super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_108.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (pmVar9->env_infos).
        super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_108.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_108.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>::~vector
                  ((vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_> *)&local_138.s);
        std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>::
        _M_move_assign(&pmVar9->variant_dependencies,&vStack_f0);
        std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>::
        _M_move_assign(&pmVar9->variant_dependencies_feature,&local_d8);
        if (local_c0.n.i64 != (Number)&local_b0) {
          operator_delete((void *)local_c0.n,CONCAT71(uStack_af,local_b0) + 1);
        }
        if (local_d8.
            super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.
                          super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d8.
                                super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.
                                super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (vStack_f0.
            super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_f0.
                          super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)vStack_f0.
                                super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_f0.
                                super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>::~vector(&local_108);
        pVVar12 = pVVar12 + 1;
        CVar5 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::MemberEnd(filters);
        uVar11 = CONCAT71((int7)((ulong)&pmVar9->variant_dependencies_feature >> 8),
                          pVVar12 == CVar5.ptr_);
        uVar10 = extraout_RDX_00;
      } while (pVVar12 != CVar5.ptr_);
    }
  }
  else {
    add_application_filters();
    uVar11 = 0;
  }
  return (bool)((byte)uVar11 & 1);
}

Assistant:

static bool add_application_filters(std::unordered_map<std::string, AppInfo> &output, const Value *filters)
{
	if (!filters->IsObject())
	{
		LOGE("Not an object.\n");
		return false;
	}

	for (auto itr = filters->MemberBegin(); itr != filters->MemberEnd(); ++itr)
	{
		if (!itr->value.IsObject())
		{
			LOGE("Not an object.\n");
			return false;
		}

		AppInfo info;

		auto &value = itr->value;
		info.minimum_api_version = default_get_member_uint(value, "minimumApiVersion");
		info.minimum_engine_version = default_get_member_uint(value, "minimumEngineVersion");
		info.minimum_application_version = default_get_member_uint(value, "minimumApplicationVersion");
		info.record_immutable_samplers = default_get_member_bool(value, "recordImmutableSamplers", true);
		if (value.HasMember("blacklistedEnvironments"))
			if (!parse_blacklist_environments(value["blacklistedEnvironments"], info.env_infos))
				return false;
		if (value.HasMember("bucketVariantDependencies"))
			if (!parse_bucket_variant_dependencies(value["bucketVariantDependencies"], info.variant_dependencies))
				return false;
		if (value.HasMember("bucketVariantFeatureDependencies"))
			if (!parse_bucket_variant_dependencies(value["bucketVariantFeatureDependencies"], info.variant_dependencies_feature))
				return false;
		output[itr->name.GetString()] = std::move(info);
	}

	return true;
}